

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
               (CodedInputStream *input,uint32 *value)

{
  byte bVar1;
  byte *pbVar2;
  int64 iVar3;
  uint32 first_byte_or_zero;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    first_byte_or_zero = (uint32)bVar1;
    if (-1 < (char)bVar1) {
      *value = (uint)bVar1;
      input->buffer_ = pbVar2 + 1;
      return true;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  iVar3 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  *value = (uint32)iVar3;
  return -1 < iVar3;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<uint32, WireFormatLite::TYPE_UINT32>(
    io::CodedInputStream* input,
    uint32* value) {
  return input->ReadVarint32(value);
}